

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void duckdb_je_arena_decay(tsdn_t *tsdn,arena_t *arena,_Bool is_background_thread,_Bool all)

{
  byte all_00;
  _Bool _Var1;
  byte in_CL;
  byte is_background_thread_00;
  byte in_DL;
  arena_t *in_RSI;
  arena_t *in_RDI;
  undefined6 unaff_retaddr;
  undefined6 in_stack_ffffffffffffffe8;
  
  is_background_thread_00 = in_DL & 1;
  all_00 = in_CL & 1;
  if (all_00 != 0) {
    duckdb_je_sec_flush((tsdn_t *)in_RSI,
                        (sec_t *)(CONCAT17(in_DL,CONCAT16(in_CL,in_stack_ffffffffffffffe8)) &
                                 0x101ffffffffffff));
  }
  _Var1 = arena_decay_dirty((tsdn_t *)CONCAT17(is_background_thread,CONCAT16(all,unaff_retaddr)),
                            in_RDI,SUB81((ulong)in_RSI >> 0x38,0),SUB81((ulong)in_RSI >> 0x30,0));
  if (!_Var1) {
    arena_decay_muzzy((tsdn_t *)in_RDI,in_RSI,(_Bool)is_background_thread_00,(_Bool)all_00);
  }
  return;
}

Assistant:

void
arena_decay(tsdn_t *tsdn, arena_t *arena, bool is_background_thread, bool all) {
	if (all) {
		/*
		 * We should take a purge of "all" to mean "save as much memory
		 * as possible", including flushing any caches (for situations
		 * like thread death, or manual purge calls).
		 */
		sec_flush(tsdn, &arena->pa_shard.hpa_sec);
	}
	if (arena_decay_dirty(tsdn, arena, is_background_thread, all)) {
		return;
	}
	arena_decay_muzzy(tsdn, arena, is_background_thread, all);
}